

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O3

Environment * iutest::TestEnv::ReleaseGlobalTestEnvironment(Environment *env)

{
  pointer __src;
  Variable *pVVar1;
  __normal_iterator<iutest::Environment_**,_std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>_>
  __dest;
  pointer ppEVar2;
  Environment *in_RDI;
  Environment *local_10;
  
  if (in_RDI != (Environment *)0x0) {
    local_10 = in_RDI;
    pVVar1 = get_vars();
    __dest = std::
             __find_if<__gnu_cxx::__normal_iterator<iutest::Environment**,std::vector<iutest::Environment*,std::allocator<iutest::Environment*>>>,__gnu_cxx::__ops::_Iter_equals_val<iutest::Environment*const>>
                       ((pVVar1->m_environment_list).
                        super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pVVar1->m_environment_list).
                        super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&local_10);
    ppEVar2 = (pVVar1->m_environment_list).
              super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (__dest._M_current != ppEVar2) {
      __src = __dest._M_current + 1;
      if (__src != ppEVar2) {
        memmove(__dest._M_current,__src,(long)ppEVar2 - (long)__src);
        ppEVar2 = (pVVar1->m_environment_list).
                  super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      (pVVar1->m_environment_list).
      super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppEVar2 + -1;
      return local_10;
    }
  }
  return (Environment *)0x0;
}

Assistant:

static Environment* ReleaseGlobalTestEnvironment(Environment* env)
    {
        if( env == NULL )
        {
            return NULL;
        }
        iuEnvironmentList& list = environments();
        iuEnvironmentList::iterator it = ::std::find(list.begin(), list.end(), env);
        if( it == list.end() )
        {
            return NULL;
        }
        list.erase(it);
        return env;
    }